

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material_info.cpp
# Opt level: O1

ostream * CMU462::Collada::operator<<(ostream *os,MaterialInfo *material)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"MaterialInfo: ",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(material->super_Instance).name._M_dataplus._M_p,
                      (material->super_Instance).name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (id:",5);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(material->super_Instance).id._M_dataplus._M_p,
                      (material->super_Instance).id._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(os," [",2);
  std::__ostream_insert<char,std::char_traits<char>>(os," BSDF=",6);
  poVar1 = std::ostream::_M_insert<void_const*>(os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ]",2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const MaterialInfo& material) {

  os << "MaterialInfo: " << material.name << " (id:" << material.id << ")";

  os << " [" << " BSDF=" << material.bsdf << " ]";

  return os;
}